

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

gravity_map_t * gravity_map_deserialize(gravity_vm *vm,json_value *json)

{
  uint n;
  json_object_entry *pjVar1;
  json_value *entry;
  gravity_map_t *pgVar2;
  gravity_map_t *pgVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_class_t **ppgVar5;
  long lVar6;
  gravity_value_t key;
  gravity_value_t value;
  gravity_map_t *local_48;
  
  n = (json->u).string.length;
  pgVar3 = gravity_map_new(vm,n);
  local_48 = (gravity_map_t *)0x0;
  for (lVar6 = 0; pgVar2 = pgVar3, (ulong)n * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    pjVar1 = (json->u).object.values;
    entry = *(json_value **)((long)&pjVar1->value + lVar6);
    key = gravity_string_to_value(vm,*(char **)((long)&pjVar1->name + lVar6),0xffffffff);
    pgVar2 = local_48;
    switch(entry->type) {
    case json_object:
      aVar4.p = gravity_object_deserialize(vm,entry);
      ppgVar5 = &(aVar4.p)->isa;
      if (aVar4.n == 0) {
        ppgVar5 = &gravity_class_null;
      }
      value.field_1.n = aVar4.n;
      value.isa = ((gravity_object_t *)ppgVar5)->isa;
      break;
    default:
      goto switchD_0012be9c_caseD_2;
    case json_integer:
      ppgVar5 = &gravity_class_int;
      goto LAB_0012bef3;
    case json_double:
      ppgVar5 = &gravity_class_float;
LAB_0012bef3:
      value.field_1 =
           (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
           (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(entry->u).integer;
      value.isa = *ppgVar5;
      break;
    case json_string:
      value = gravity_string_to_value(vm,(entry->u).string.ptr,(entry->u).string.length);
      break;
    case json_boolean:
      value.field_1 =
           (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
           (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(entry->u).boolean;
      value.isa = gravity_class_bool;
      break;
    case json_null:
      value.field_1.n = 0;
      value.isa = gravity_class_null;
    }
    gravity_hash_insert(pgVar3->hash,key,value);
  }
switchD_0012be9c_caseD_2:
  local_48 = pgVar2;
  return local_48;
}

Assistant:

static gravity_map_t *gravity_map_deserialize (gravity_vm *vm, json_value *json) {
    uint32_t n = json->u.object.length;
    gravity_map_t *map = gravity_map_new(vm, n);

    DEBUG_DESERIALIZE("DESERIALIZE MAP: %p\n", map);

    for (uint32_t i=0; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *jsonv = json->u.object.values[i].value;

        gravity_value_t key = VALUE_FROM_CSTRING(vm, label);
        gravity_value_t value;

        switch (jsonv->type) {
            case json_integer:
                value = VALUE_FROM_INT((gravity_int_t)jsonv->u.integer); break;
            case json_double:
                value = VALUE_FROM_FLOAT((gravity_float_t)jsonv->u.dbl); break;
            case json_boolean:
                value = VALUE_FROM_BOOL(jsonv->u.boolean); break;
            case json_string:
                value = VALUE_FROM_STRING(vm, jsonv->u.string.ptr, jsonv->u.string.length); break;
            case json_null:
                value = VALUE_FROM_NULL; break;
            case json_object: {
                gravity_object_t *obj = gravity_object_deserialize(vm, jsonv);
                value = (obj) ? VALUE_FROM_OBJECT(obj) : VALUE_FROM_NULL;
                break;
            }
            case json_array: {
                
            }
            default:
                goto abort_load;
        }

        gravity_map_insert(NULL, map, key, value);
    }
    return map;

abort_load:
    // do not free map here because it is already garbage collected
    return NULL;
}